

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O0

PAL_ERROR __thiscall CorUnix::CPalString::CopyString(CPalString *this,CPalString *psSource)

{
  DWORD DVar1;
  DWORD DVar2;
  WCHAR *__dest;
  WCHAR *pWVar3;
  WCHAR *pwsz;
  PAL_ERROR palError;
  CPalString *psSource_local;
  CPalString *this_local;
  
  pwsz._4_4_ = 0;
  if (psSource == (CPalString *)0x0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x30);
    fprintf(_stderr,"Expression: NULL != psSource\n");
  }
  if (this->m_pwsz != (WCHAR *)0x0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x31);
    fprintf(_stderr,"Expression: NULL == m_pwsz\n");
  }
  if (this->m_dwStringLength != 0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x32);
    fprintf(_stderr,"Expression: 0 == m_dwStringLength\n");
  }
  if (this->m_dwMaxLength != 0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x33);
    fprintf(_stderr,"Expression: 0 == m_dwMaxLength\n");
  }
  DVar1 = GetStringLength(psSource);
  if (DVar1 != 0) {
    DVar1 = GetMaxLength(psSource);
    DVar2 = GetStringLength(psSource);
    if (DVar1 <= DVar2) {
      fprintf(_stderr,"] %s %s:%d","CopyString",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
              ,0x37);
      fprintf(_stderr,"Expression: psSource->GetMaxLength() > psSource->GetStringLength()\n");
    }
    DVar1 = GetMaxLength(psSource);
    __dest = (WCHAR *)InternalMalloc((ulong)DVar1 << 1);
    if (__dest == (WCHAR *)0x0) {
      pwsz._4_4_ = 0xe;
    }
    else {
      pWVar3 = GetString(psSource);
      if (pWVar3 == (WCHAR *)0x0) {
        fprintf(_stderr,"] %s %s:%d","CopyString",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
                ,0x3f);
        fprintf(_stderr,"Expression: NULL != psSource->GetString()\n");
      }
      pWVar3 = GetString(psSource);
      DVar1 = GetMaxLength(psSource);
      memcpy(__dest,pWVar3,(ulong)DVar1 << 1);
      this->m_pwsz = __dest;
      DVar1 = GetStringLength(psSource);
      this->m_dwStringLength = DVar1;
      DVar1 = GetMaxLength(psSource);
      this->m_dwMaxLength = DVar1;
    }
  }
  return pwsz._4_4_;
}

Assistant:

PAL_ERROR
CPalString::CopyString(
    CPalString *psSource
    )
{
    PAL_ERROR palError = NO_ERROR;
        
    _ASSERTE(NULL != psSource);
    _ASSERTE(NULL == m_pwsz);
    _ASSERTE(0 == m_dwStringLength);
    _ASSERTE(0 == m_dwMaxLength);

    if (0 != psSource->GetStringLength())
    {
        _ASSERTE(psSource->GetMaxLength() > psSource->GetStringLength());
        
        WCHAR *pwsz = reinterpret_cast<WCHAR*>(
            InternalMalloc(psSource->GetMaxLength() * sizeof(WCHAR))
            );

        if (NULL != pwsz)
        {
            _ASSERTE(NULL != psSource->GetString());

            CopyMemory(
                pwsz,
                psSource->GetString(),
                psSource->GetMaxLength() * sizeof(WCHAR)
                );

            m_pwsz = pwsz;
            m_dwStringLength = psSource->GetStringLength();
            m_dwMaxLength = psSource->GetMaxLength();
        }
        else
        {
            palError = ERROR_OUTOFMEMORY;
        }
    }

    return palError;
}